

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

_tExecReaction __thiscall yactfr::internal::Vm::_execEndReadOptSIntSel(Vm *this,Instr *instr)

{
  OptionalWithSignedIntegerSelectorEndElement *elem;
  Index IVar1;
  Index IVar2;
  ElementSequenceIterator *pEVar3;
  
  elem = &(this->_pos).elems.optSIntSelEnd;
  _setDataElemFromInstr<yactfr::OptionalWithSignedIntegerSelectorEndElement>(elem,instr);
  IVar1 = (this->_pos).headOffsetInCurPktBits;
  IVar2 = (this->_pos).curPktOffsetInElemSeqBits;
  pEVar3 = this->_it;
  pEVar3->_curElem = (Element *)elem;
  pEVar3->_offset = IVar1 + IVar2;
  pEVar3->_mark = pEVar3->_mark + 1;
  VmPos::setParentStateAndStackPop(&this->_pos);
  return Stop;
}

Assistant:

Vm::_tExecReaction Vm::_execEndReadOptSIntSel(const Instr& instr)
{
    this->_setDataElemFromInstr(_pos.elems.optSIntSelEnd, instr);
    this->_updateItForUser(_pos.elems.optSIntSelEnd);
    _pos.setParentStateAndStackPop();
    return _tExecReaction::Stop;
}